

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O2

void ihevc_intra_pred_luma_mode_3_to_9_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [14];
  undefined1 auVar68 [12];
  unkbyte10 Var69;
  undefined1 auVar70 [14];
  undefined1 auVar71 [12];
  unkbyte10 Var72;
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [12];
  undefined1 auVar76 [14];
  undefined1 auVar77 [12];
  undefined1 auVar78 [14];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  unkbyte9 Var82;
  unkbyte9 Var83;
  undefined6 uVar84;
  undefined2 uVar85;
  undefined6 uVar86;
  undefined4 uVar87;
  undefined2 uVar88;
  UWORD8 aUVar89 [16];
  long lVar90;
  UWORD8 *pUVar91;
  long lVar92;
  UWORD8 *pUVar93;
  UWORD8 *pUVar94;
  ulong uVar95;
  ulong uVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  short sVar104;
  short sVar105;
  undefined4 uVar106;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar127;
  short sVar129;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  short sVar121;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  short sVar122;
  short sVar126;
  short sVar128;
  short sVar130;
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined2 uVar131;
  undefined4 uVar132;
  undefined4 uVar160;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined2 uVar161;
  undefined4 uVar162;
  undefined1 auVar165 [12];
  undefined1 in_XMM2 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined4 uVar182;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined4 uVar183;
  undefined1 auVar185 [12];
  undefined1 in_XMM3 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar196 [12];
  undefined1 in_XMM4 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar208 [12];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar224 [16];
  short sVar227;
  short sVar228;
  short sVar229;
  short sVar230;
  short sVar231;
  undefined1 in_XMM6 [16];
  short sVar232;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined4 uVar233;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  short local_68;
  short sStack_66;
  undefined1 auVar107 [12];
  undefined1 auVar119 [16];
  undefined4 uVar133;
  undefined6 uVar134;
  undefined1 auVar145 [16];
  undefined1 auVar154 [16];
  undefined8 uVar135;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar155 [16];
  undefined1 auVar136 [12];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar156 [16];
  undefined1 auVar137 [14];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar159 [16];
  undefined6 uVar163;
  undefined1 auVar166 [12];
  undefined8 uVar164;
  undefined1 auVar167 [12];
  undefined1 auVar180 [16];
  undefined1 auVar174 [16];
  undefined1 auVar168 [14];
  undefined1 auVar181 [16];
  undefined1 auVar178 [16];
  undefined1 auVar184 [12];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  short sVar195;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar197 [14];
  undefined1 auVar207 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar221 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar234 [12];
  undefined1 auVar235 [14];
  undefined1 auVar238 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  
  aUVar89 = IHEVCE_SHUFFLEMASKY11;
  uVar1 = gai4_ihevc_ang_table[mode];
  if ((nt == 0x20) || (nt == 0x10)) {
    auVar139 = pshuflw(ZEXT416(uVar1),ZEXT416(uVar1),0);
    auVar169 = pshuflw(ZEXT416((uint)nt),ZEXT416((uint)nt),0);
    sVar104 = auVar169._0_2_;
    sVar121 = auVar169._2_2_;
    lVar90 = (long)dst_strd;
    pUVar91 = pu1_dst + lVar90 * 7;
    auVar169 = pmovsxbw(in_XMM3,0x807060504030201);
    uVar95 = 0;
    auVar209 = pmovsxbw(in_XMM6,0x1010101010101010);
    for (; uVar95 < (uint)nt; uVar95 = uVar95 + 8) {
      local_68 = auVar139._0_2_;
      sStack_66 = auVar139._2_2_;
      auVar188._0_2_ = auVar169._0_2_ * local_68;
      sVar105 = auVar169._2_2_;
      auVar188._2_2_ = sVar105 * sStack_66;
      sVar122 = auVar169._4_2_;
      auVar188._4_2_ = sVar122 * local_68;
      sVar125 = auVar169._6_2_;
      auVar188._6_2_ = sVar125 * sStack_66;
      sVar127 = auVar169._8_2_;
      auVar188._8_2_ = sVar127 * local_68;
      sVar123 = auVar169._10_2_;
      auVar188._10_2_ = sVar123 * sStack_66;
      sVar124 = auVar169._12_2_;
      sVar195 = auVar169._14_2_;
      auVar188._12_2_ = sVar124 * local_68;
      auVar188._14_2_ = sVar195 * sStack_66;
      auVar198 = auVar188 & _DAT_0016bfa0;
      auVar186 = pmovsxbw(in_XMM4,0x2020202020202020);
      auVar200._0_2_ = auVar186._0_2_ - auVar198._0_2_;
      auVar200._2_2_ = auVar186._2_2_ - auVar198._2_2_;
      auVar200._4_2_ = auVar186._4_2_ - auVar198._4_2_;
      auVar200._6_2_ = auVar186._6_2_ - auVar198._6_2_;
      auVar200._8_2_ = auVar186._8_2_ - auVar198._8_2_;
      auVar200._10_2_ = auVar186._10_2_ - auVar198._10_2_;
      auVar200._12_2_ = auVar186._12_2_ - auVar198._12_2_;
      auVar200._14_2_ = auVar186._14_2_ - auVar198._14_2_;
      auVar218 = psllw(auVar198,8);
      auVar186 = psllw(auVar200,8);
      auVar218 = auVar218 | auVar198;
      auVar186 = auVar186 | auVar200;
      uVar133 = CONCAT13(auVar218[9],CONCAT12(auVar186[9],CONCAT11(auVar218[8],auVar186[8])));
      auVar165._0_8_ =
           CONCAT17(auVar218[0xb],
                    CONCAT16(auVar186[0xb],CONCAT15(auVar218[10],CONCAT14(auVar186[10],uVar133))));
      auVar165[8] = auVar186[0xc];
      auVar165[9] = auVar218[0xc];
      auVar165[10] = auVar186[0xd];
      auVar165[0xb] = auVar218[0xd];
      auVar243[0xc] = auVar186[0xe];
      auVar243._0_12_ = auVar165;
      auVar243[0xd] = auVar218[0xe];
      auVar243[0xe] = auVar186[0xf];
      auVar243[0xf] = auVar218[0xf];
      auVar242._0_14_ = auVar186._0_14_;
      auVar242[0xe] = auVar186[7];
      auVar242[0xf] = auVar218[7];
      auVar236._14_2_ = auVar242._14_2_;
      auVar236._0_13_ = auVar186._0_13_;
      auVar236[0xd] = auVar218[6];
      auVar256._13_3_ = auVar236._13_3_;
      auVar256._0_12_ = auVar186._0_12_;
      auVar256[0xc] = auVar186[6];
      auVar254._12_4_ = auVar256._12_4_;
      auVar254._0_11_ = auVar186._0_11_;
      auVar254[0xb] = auVar218[5];
      auVar239._11_5_ = auVar254._11_5_;
      auVar239._0_10_ = auVar186._0_10_;
      auVar239[10] = auVar186[5];
      auVar225._10_6_ = auVar239._10_6_;
      auVar225._0_9_ = auVar186._0_9_;
      auVar225[9] = auVar218[4];
      auVar202._9_7_ = auVar225._9_7_;
      auVar202._0_8_ = auVar186._0_8_;
      auVar202[8] = auVar186[4];
      auVar66._4_8_ = auVar202._8_8_;
      auVar66[3] = auVar218[3];
      auVar66[2] = auVar186[3];
      auVar66[1] = auVar218[2];
      auVar66[0] = auVar186[2];
      auVar198._4_12_ = auVar66;
      auVar198[3] = auVar218[1];
      auVar198[2] = auVar186[1];
      auVar198[0] = auVar186[0];
      auVar198[1] = auVar218[0];
      auVar186 = psraw(auVar188,5);
      in_XMM4._0_2_ = sVar104 * 2 - auVar186._0_2_;
      in_XMM4._2_2_ = sVar121 * 2 - auVar186._2_2_;
      in_XMM4._4_2_ = sVar104 * 2 - auVar186._4_2_;
      in_XMM4._6_2_ = sVar121 * 2 - auVar186._6_2_;
      in_XMM4._8_2_ = sVar104 * 2 - auVar186._8_2_;
      in_XMM4._10_2_ = sVar121 * 2 - auVar186._10_2_;
      in_XMM4._12_2_ = sVar104 * 2 - auVar186._12_2_;
      in_XMM4._14_2_ = sVar121 * 2 - auVar186._14_2_;
      lVar97 = (long)in_XMM4._0_2_;
      lVar98 = (long)in_XMM4._2_2_;
      lVar99 = (long)in_XMM4._4_2_;
      lVar92 = (long)in_XMM4._6_2_;
      lVar102 = (long)in_XMM4._8_2_;
      lVar103 = (long)in_XMM4._10_2_;
      lVar100 = (long)in_XMM4._12_2_;
      lVar101 = (long)in_XMM4._14_2_;
      uVar132 = auVar198._0_4_;
      uVar160 = auVar66._0_4_;
      uVar106 = auVar202._8_4_;
      auVar186._4_4_ = uVar160;
      auVar186._0_4_ = uVar160;
      auVar186._8_4_ = uVar160;
      auVar186._12_4_ = uVar160;
      auVar218._4_4_ = uVar106;
      auVar218._0_4_ = uVar106;
      auVar218._8_4_ = uVar106;
      auVar218._12_4_ = uVar106;
      uVar160 = (undefined4)((ulong)auVar165._0_8_ >> 0x20);
      uVar106 = auVar165._8_4_;
      uVar182 = auVar243._12_4_;
      pUVar93 = pUVar91;
      pUVar94 = pu1_ref;
      for (uVar96 = 0; uVar96 < (uint)nt; uVar96 = uVar96 + 8) {
        auVar198 = pshufb(*(undefined1 (*) [16])(pUVar94 + lVar97 + -9),(undefined1  [16])aUVar89);
        auVar61._4_4_ = uVar132;
        auVar61._0_4_ = uVar132;
        auVar61._8_4_ = uVar132;
        auVar61._12_4_ = uVar132;
        auVar198 = pmaddubsw(auVar198,auVar61);
        auVar202 = pshufb(*(undefined1 (*) [16])(pUVar94 + lVar99 + -9),(undefined1  [16])aUVar89);
        auVar202 = pmaddubsw(auVar202,auVar218);
        sVar128 = auVar209._0_2_;
        auVar201._0_2_ = auVar198._0_2_ + sVar128;
        sVar227 = auVar209._2_2_;
        auVar201._2_2_ = auVar198._2_2_ + sVar227;
        sVar130 = auVar209._4_2_;
        auVar201._4_2_ = auVar198._4_2_ + sVar130;
        sVar228 = auVar209._6_2_;
        auVar201._6_2_ = auVar198._6_2_ + sVar228;
        sVar229 = auVar209._8_2_;
        auVar201._8_2_ = auVar198._8_2_ + sVar229;
        sVar230 = auVar209._10_2_;
        auVar201._10_2_ = auVar198._10_2_ + sVar230;
        sVar231 = auVar209._12_2_;
        auVar201._12_2_ = auVar198._12_2_ + sVar231;
        sVar232 = auVar209._14_2_;
        auVar201._14_2_ = auVar198._14_2_ + sVar232;
        auVar241._0_2_ = auVar202._0_2_ + sVar128;
        auVar241._2_2_ = auVar202._2_2_ + sVar227;
        auVar241._4_2_ = auVar202._4_2_ + sVar130;
        auVar241._6_2_ = auVar202._6_2_ + sVar228;
        auVar241._8_2_ = auVar202._8_2_ + sVar229;
        auVar241._10_2_ = auVar202._10_2_ + sVar230;
        auVar241._12_2_ = auVar202._12_2_ + sVar231;
        auVar241._14_2_ = auVar202._14_2_ + sVar232;
        auVar239 = psraw(auVar201,5);
        auVar242 = psraw(auVar241,5);
        sVar4 = auVar239._0_2_;
        sVar5 = auVar239._2_2_;
        sVar6 = auVar239._4_2_;
        sVar8 = auVar239._6_2_;
        sVar10 = auVar239._8_2_;
        sVar14 = auVar239._10_2_;
        sVar18 = auVar239._12_2_;
        sVar126 = auVar239._14_2_;
        cVar2 = (0 < sVar126) * (sVar126 < 0x100) * auVar239[0xe] - (0xff < sVar126);
        sVar24 = auVar242._0_2_;
        sVar28 = auVar242._2_2_;
        sVar32 = auVar242._4_2_;
        sVar37 = auVar242._6_2_;
        sVar45 = auVar242._8_2_;
        sVar53 = auVar242._10_2_;
        sVar40 = auVar242._12_2_;
        sVar48 = auVar242._14_2_;
        auVar198 = pshufb(*(undefined1 (*) [16])(pUVar94 + lVar98 + -9),(undefined1  [16])aUVar89);
        auVar256 = pmaddubsw(auVar198,auVar186);
        auVar198 = pshufb(*(undefined1 (*) [16])(pUVar94 + lVar92 + -9),(undefined1  [16])aUVar89);
        auVar56._4_4_ = auVar254._12_4_;
        auVar56._0_4_ = auVar254._12_4_;
        auVar56._8_4_ = auVar254._12_4_;
        auVar56._12_4_ = auVar254._12_4_;
        auVar225 = pmaddubsw(auVar198,auVar56);
        auVar198 = pshufb(*(undefined1 (*) [16])(pUVar94 + lVar102 + -9),(undefined1  [16])aUVar89);
        auVar57._4_4_ = uVar133;
        auVar57._0_4_ = uVar133;
        auVar57._8_4_ = uVar133;
        auVar57._12_4_ = uVar133;
        auVar236 = pmaddubsw(auVar198,auVar57);
        auVar198 = pshufb(*(undefined1 (*) [16])(pUVar94 + lVar103 + -9),(undefined1  [16])aUVar89);
        auVar58._4_4_ = uVar160;
        auVar58._0_4_ = uVar160;
        auVar58._8_4_ = uVar160;
        auVar58._12_4_ = uVar160;
        auVar198 = pmaddubsw(auVar198,auVar58);
        auVar202 = pshufb(*(undefined1 (*) [16])(pUVar94 + lVar100 + -9),(undefined1  [16])aUVar89);
        auVar59._4_4_ = uVar106;
        auVar59._0_4_ = uVar106;
        auVar59._8_4_ = uVar106;
        auVar59._12_4_ = uVar106;
        auVar202 = pmaddubsw(auVar202,auVar59);
        auVar243 = pshufb(*(undefined1 (*) [16])(pUVar94 + lVar101 + -9),(undefined1  [16])aUVar89);
        auVar60._4_4_ = uVar182;
        auVar60._0_4_ = uVar182;
        auVar60._8_4_ = uVar182;
        auVar60._12_4_ = uVar182;
        auVar243 = pmaddubsw(auVar243,auVar60);
        auVar219._0_2_ = auVar256._0_2_ + sVar128;
        auVar219._2_2_ = auVar256._2_2_ + sVar227;
        auVar219._4_2_ = auVar256._4_2_ + sVar130;
        auVar219._6_2_ = auVar256._6_2_ + sVar228;
        auVar219._8_2_ = auVar256._8_2_ + sVar229;
        auVar219._10_2_ = auVar256._10_2_ + sVar230;
        auVar219._12_2_ = auVar256._12_2_ + sVar231;
        auVar219._14_2_ = auVar256._14_2_ + sVar232;
        auVar189._0_2_ = auVar225._0_2_ + sVar128;
        auVar189._2_2_ = auVar225._2_2_ + sVar227;
        auVar189._4_2_ = auVar225._4_2_ + sVar130;
        auVar189._6_2_ = auVar225._6_2_ + sVar228;
        auVar189._8_2_ = auVar225._8_2_ + sVar229;
        auVar189._10_2_ = auVar225._10_2_ + sVar230;
        auVar189._12_2_ = auVar225._12_2_ + sVar231;
        auVar189._14_2_ = auVar225._14_2_ + sVar232;
        auVar256 = psraw(auVar219,5);
        auVar225 = psraw(auVar189,5);
        sVar126 = auVar256._0_2_;
        sVar129 = auVar256._2_2_;
        sVar7 = auVar256._4_2_;
        sVar9 = auVar256._6_2_;
        sVar11 = auVar256._8_2_;
        sVar15 = auVar256._10_2_;
        sVar19 = auVar256._12_2_;
        sVar22 = auVar256._14_2_;
        sVar25 = auVar225._0_2_;
        sVar29 = auVar225._2_2_;
        sVar33 = auVar225._4_2_;
        sVar38 = auVar225._6_2_;
        sVar46 = auVar225._8_2_;
        sVar54 = auVar225._10_2_;
        sVar41 = auVar225._12_2_;
        sVar49 = auVar225._14_2_;
        auVar237._0_2_ = auVar236._0_2_ + sVar128;
        auVar237._2_2_ = auVar236._2_2_ + sVar227;
        auVar237._4_2_ = auVar236._4_2_ + sVar130;
        auVar237._6_2_ = auVar236._6_2_ + sVar228;
        auVar237._8_2_ = auVar236._8_2_ + sVar229;
        auVar237._10_2_ = auVar236._10_2_ + sVar230;
        auVar237._12_2_ = auVar236._12_2_ + sVar231;
        auVar237._14_2_ = auVar236._14_2_ + sVar232;
        auVar152._0_2_ = auVar198._0_2_ + sVar128;
        auVar152._2_2_ = auVar198._2_2_ + sVar227;
        auVar152._4_2_ = auVar198._4_2_ + sVar130;
        auVar152._6_2_ = auVar198._6_2_ + sVar228;
        auVar152._8_2_ = auVar198._8_2_ + sVar229;
        auVar152._10_2_ = auVar198._10_2_ + sVar230;
        auVar152._12_2_ = auVar198._12_2_ + sVar231;
        auVar152._14_2_ = auVar198._14_2_ + sVar232;
        auVar172._0_2_ = auVar202._0_2_ + sVar128;
        auVar172._2_2_ = auVar202._2_2_ + sVar227;
        auVar172._4_2_ = auVar202._4_2_ + sVar130;
        auVar172._6_2_ = auVar202._6_2_ + sVar228;
        auVar172._8_2_ = auVar202._8_2_ + sVar229;
        auVar172._10_2_ = auVar202._10_2_ + sVar230;
        auVar172._12_2_ = auVar202._12_2_ + sVar231;
        auVar172._14_2_ = auVar202._14_2_ + sVar232;
        auVar244._0_2_ = auVar243._0_2_ + sVar128;
        auVar244._2_2_ = auVar243._2_2_ + sVar227;
        auVar244._4_2_ = auVar243._4_2_ + sVar130;
        auVar244._6_2_ = auVar243._6_2_ + sVar228;
        auVar244._8_2_ = auVar243._8_2_ + sVar229;
        auVar244._10_2_ = auVar243._10_2_ + sVar230;
        auVar244._12_2_ = auVar243._12_2_ + sVar231;
        auVar244._14_2_ = auVar243._14_2_ + sVar232;
        auVar236 = psraw(auVar237,5);
        auVar198 = psraw(auVar152,5);
        auVar202 = psraw(auVar172,5);
        sVar128 = auVar236._0_2_;
        sVar130 = auVar236._2_2_;
        sVar229 = auVar236._4_2_;
        sVar231 = auVar236._6_2_;
        sVar12 = auVar236._8_2_;
        sVar16 = auVar236._10_2_;
        sVar20 = auVar236._12_2_;
        sVar227 = auVar236._14_2_;
        cVar3 = (0 < sVar227) * (sVar227 < 0x100) * auVar236[0xe] - (0xff < sVar227);
        sVar26 = auVar202._0_2_;
        sVar30 = auVar202._2_2_;
        sVar34 = auVar202._4_2_;
        sVar39 = auVar202._6_2_;
        sVar47 = auVar202._8_2_;
        sVar55 = auVar202._10_2_;
        sVar42 = auVar202._12_2_;
        sVar50 = auVar202._14_2_;
        auVar243 = psraw(auVar244,5);
        sVar227 = auVar198._0_2_;
        sVar228 = auVar198._2_2_;
        sVar230 = auVar198._4_2_;
        sVar232 = auVar198._6_2_;
        sVar13 = auVar198._8_2_;
        sVar17 = auVar198._10_2_;
        sVar21 = auVar198._12_2_;
        sVar23 = auVar198._14_2_;
        sVar27 = auVar243._0_2_;
        sVar31 = auVar243._2_2_;
        sVar36 = auVar243._4_2_;
        sVar44 = auVar243._6_2_;
        sVar52 = auVar243._8_2_;
        sVar35 = auVar243._10_2_;
        sVar43 = auVar243._12_2_;
        sVar51 = auVar243._14_2_;
        uVar85 = CONCAT11((0 < sVar22) * (sVar22 < 0x100) * auVar256[0xe] - (0xff < sVar22),cVar2);
        uVar183 = CONCAT31(CONCAT21(uVar85,(0 < sVar19) * (sVar19 < 0x100) * auVar256[0xc] -
                                           (0xff < sVar19)),
                           (0 < sVar18) * (sVar18 < 0x100) * auVar239[0xc] - (0xff < sVar18));
        uVar84 = CONCAT51(CONCAT41(uVar183,(0 < sVar15) * (sVar15 < 0x100) * auVar256[10] -
                                           (0xff < sVar15)),
                          (0 < sVar14) * (sVar14 < 0x100) * auVar239[10] - (0xff < sVar14));
        Var82 = CONCAT72(CONCAT61(uVar84,(0 < sVar11) * (sVar11 < 0x100) * auVar256[8] -
                                         (0xff < sVar11)),
                         CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar239[8] - (0xff < sVar10),
                                  cVar2));
        Var69 = CONCAT91(CONCAT81((long)((unkuint9)Var82 >> 8),
                                  (0 < sVar9) * (sVar9 < 0x100) * auVar256[6] - (0xff < sVar9)),
                         (0 < sVar8) * (sVar8 < 0x100) * auVar239[6] - (0xff < sVar8));
        auVar68._2_10_ = Var69;
        auVar68[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar256[4] - (0xff < sVar7);
        auVar68[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar239[4] - (0xff < sVar6);
        auVar67._2_12_ = auVar68;
        auVar67[1] = (0 < sVar129) * (sVar129 < 0x100) * auVar256[2] - (0xff < sVar129);
        auVar67[0] = (0 < sVar5) * (sVar5 < 0x100) * auVar239[2] - (0xff < sVar5);
        auVar173._0_2_ =
             CONCAT11((0 < sVar126) * (sVar126 < 0x100) * auVar256[0] - (0xff < sVar126),
                      (0 < sVar4) * (sVar4 < 0x100) * auVar239[0] - (0xff < sVar4));
        auVar173._2_14_ = auVar67;
        uVar131 = CONCAT11((0 < sVar25) * (sVar25 < 0x100) * auVar225[0] - (0xff < sVar25),
                           (0 < sVar24) * (sVar24 < 0x100) * auVar242[0] - (0xff < sVar24));
        uVar162 = CONCAT13((0 < sVar29) * (sVar29 < 0x100) * auVar225[2] - (0xff < sVar29),
                           CONCAT12((0 < sVar28) * (sVar28 < 0x100) * auVar242[2] - (0xff < sVar28),
                                    uVar131));
        uVar134 = CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar225[4] - (0xff < sVar33),
                           CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar242[4] - (0xff < sVar32),
                                    uVar162));
        uVar135 = CONCAT17((0 < sVar38) * (sVar38 < 0x100) * auVar225[6] - (0xff < sVar38),
                           CONCAT16((0 < sVar37) * (sVar37 < 0x100) * auVar242[6] - (0xff < sVar37),
                                    uVar134));
        auVar196._0_10_ =
             CONCAT19((0 < sVar46) * (sVar46 < 0x100) * auVar225[8] - (0xff < sVar46),
                      CONCAT18((0 < sVar45) * (sVar45 < 0x100) * auVar242[8] - (0xff < sVar45),
                               uVar135));
        auVar196[10] = (0 < sVar53) * (sVar53 < 0x100) * auVar242[10] - (0xff < sVar53);
        auVar196[0xb] = (0 < sVar54) * (sVar54 < 0x100) * auVar225[10] - (0xff < sVar54);
        auVar197[0xc] = (0 < sVar40) * (sVar40 < 0x100) * auVar242[0xc] - (0xff < sVar40);
        auVar197._0_12_ = auVar196;
        auVar197[0xd] = (0 < sVar41) * (sVar41 < 0x100) * auVar225[0xc] - (0xff < sVar41);
        in_XMM4[0xe] = (0 < sVar48) * (sVar48 < 0x100) * auVar242[0xe] - (0xff < sVar48);
        in_XMM4._0_14_ = auVar197;
        in_XMM4[0xf] = (0 < sVar49) * (sVar49 < 0x100) * auVar225[0xe] - (0xff < sVar49);
        uVar88 = CONCAT11((0 < sVar23) * (sVar23 < 0x100) * auVar198[0xe] - (0xff < sVar23),cVar3);
        uVar87 = CONCAT31(CONCAT21(uVar88,(0 < sVar21) * (sVar21 < 0x100) * auVar198[0xc] -
                                          (0xff < sVar21)),
                          (0 < sVar20) * (sVar20 < 0x100) * auVar236[0xc] - (0xff < sVar20));
        uVar86 = CONCAT51(CONCAT41(uVar87,(0 < sVar17) * (sVar17 < 0x100) * auVar198[10] -
                                          (0xff < sVar17)),
                          (0 < sVar16) * (sVar16 < 0x100) * auVar236[10] - (0xff < sVar16));
        Var83 = CONCAT72(CONCAT61(uVar86,(0 < sVar13) * (sVar13 < 0x100) * auVar198[8] -
                                         (0xff < sVar13)),
                         CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar236[8] - (0xff < sVar12),
                                  cVar3));
        Var72 = CONCAT91(CONCAT81((long)((unkuint9)Var83 >> 8),
                                  (0 < sVar232) * (sVar232 < 0x100) * auVar198[6] - (0xff < sVar232)
                                 ),
                         (0 < sVar231) * (sVar231 < 0x100) * auVar236[6] - (0xff < sVar231));
        auVar71._2_10_ = Var72;
        auVar71[1] = (0 < sVar230) * (sVar230 < 0x100) * auVar198[4] - (0xff < sVar230);
        auVar71[0] = (0 < sVar229) * (sVar229 < 0x100) * auVar236[4] - (0xff < sVar229);
        auVar70._2_12_ = auVar71;
        auVar70[1] = (0 < sVar228) * (sVar228 < 0x100) * auVar198[2] - (0xff < sVar228);
        auVar70[0] = (0 < sVar130) * (sVar130 < 0x100) * auVar236[2] - (0xff < sVar130);
        auVar190._0_2_ =
             CONCAT11((0 < sVar227) * (sVar227 < 0x100) * auVar198[0] - (0xff < sVar227),
                      (0 < sVar128) * (sVar128 < 0x100) * auVar236[0] - (0xff < sVar128));
        auVar190._2_14_ = auVar70;
        uVar161 = CONCAT11((0 < sVar27) * (sVar27 < 0x100) * auVar243[0] - (0xff < sVar27),
                           (0 < sVar26) * (sVar26 < 0x100) * auVar202[0] - (0xff < sVar26));
        uVar233 = CONCAT13((0 < sVar31) * (sVar31 < 0x100) * auVar243[2] - (0xff < sVar31),
                           CONCAT12((0 < sVar30) * (sVar30 < 0x100) * auVar202[2] - (0xff < sVar30),
                                    uVar161));
        uVar163 = CONCAT15((0 < sVar36) * (sVar36 < 0x100) * auVar243[4] - (0xff < sVar36),
                           CONCAT14((0 < sVar34) * (sVar34 < 0x100) * auVar202[4] - (0xff < sVar34),
                                    uVar233));
        uVar164 = CONCAT17((0 < sVar44) * (sVar44 < 0x100) * auVar243[6] - (0xff < sVar44),
                           CONCAT16((0 < sVar39) * (sVar39 < 0x100) * auVar202[6] - (0xff < sVar39),
                                    uVar163));
        auVar234._0_10_ =
             CONCAT19((0 < sVar52) * (sVar52 < 0x100) * auVar243[8] - (0xff < sVar52),
                      CONCAT18((0 < sVar47) * (sVar47 < 0x100) * auVar202[8] - (0xff < sVar47),
                               uVar164));
        auVar234[10] = (0 < sVar55) * (sVar55 < 0x100) * auVar202[10] - (0xff < sVar55);
        auVar234[0xb] = (0 < sVar35) * (sVar35 < 0x100) * auVar243[10] - (0xff < sVar35);
        auVar235[0xc] = (0 < sVar42) * (sVar42 < 0x100) * auVar202[0xc] - (0xff < sVar42);
        auVar235._0_12_ = auVar234;
        auVar235[0xd] = (0 < sVar43) * (sVar43 < 0x100) * auVar243[0xc] - (0xff < sVar43);
        auVar238[0xe] = (0 < sVar50) * (sVar50 < 0x100) * auVar202[0xe] - (0xff < sVar50);
        auVar238._0_14_ = auVar235;
        auVar238[0xf] = (0 < sVar51) * (sVar51 < 0x100) * auVar243[0xe] - (0xff < sVar51);
        auVar156._0_12_ = auVar173._0_12_;
        auVar156._12_2_ = (short)Var69;
        auVar156._14_2_ = (short)((ulong)uVar135 >> 0x30);
        auVar155._12_4_ = auVar156._12_4_;
        auVar155._0_10_ = auVar173._0_10_;
        auVar155._10_2_ = (short)((uint6)uVar134 >> 0x20);
        auVar154._10_6_ = auVar155._10_6_;
        auVar154._0_8_ = auVar173._0_8_;
        auVar154._8_2_ = auVar68._0_2_;
        auVar73._4_8_ = auVar154._8_8_;
        auVar73._2_2_ = (short)((uint)uVar162 >> 0x10);
        auVar73._0_2_ = auVar67._0_2_;
        auVar153._0_4_ = CONCAT22(uVar131,auVar173._0_2_);
        auVar153._4_12_ = auVar73;
        auVar222._0_12_ = auVar190._0_12_;
        auVar222._12_2_ = (short)Var72;
        auVar222._14_2_ = (short)((ulong)uVar164 >> 0x30);
        auVar221._12_4_ = auVar222._12_4_;
        auVar221._0_10_ = auVar190._0_10_;
        auVar221._10_2_ = (short)((uint6)uVar163 >> 0x20);
        auVar220._10_6_ = auVar221._10_6_;
        auVar220._0_8_ = auVar190._0_8_;
        auVar220._8_2_ = auVar71._0_2_;
        auVar74._4_8_ = auVar220._8_8_;
        auVar74._2_2_ = (short)((uint)uVar233 >> 0x10);
        auVar74._0_2_ = auVar70._0_2_;
        auVar245._0_8_ = auVar153._0_8_;
        auVar245._8_4_ = auVar73._0_4_;
        auVar245._12_4_ = auVar74._0_4_;
        *(ulong *)pUVar93 = CONCAT44(CONCAT22(uVar161,auVar190._0_2_),auVar153._0_4_);
        *(long *)(pUVar93 + -lVar90) = auVar245._8_8_;
        *(int *)(pUVar93 + lVar90 * -2) = auVar154._8_4_;
        *(int *)(pUVar93 + lVar90 * -2 + 4) = auVar220._8_4_;
        *(undefined4 *)(pUVar93 + lVar90 * -3 + 8) = auVar155._12_4_;
        *(undefined4 *)(pUVar93 + lVar90 * -3 + 0xc) = auVar221._12_4_;
        uVar162 = CONCAT22((short)((unkuint10)auVar196._0_10_ >> 0x40),(short)((unkuint9)Var82 >> 8)
                          );
        auVar166._0_8_ = CONCAT26(auVar196._10_2_,CONCAT24((short)uVar84,uVar162));
        auVar166._8_2_ = (short)uVar183;
        auVar166._10_2_ = auVar197._12_2_;
        auVar174._12_2_ = uVar85;
        auVar174._0_12_ = auVar166;
        auVar174._14_2_ = in_XMM4._14_2_;
        uVar183 = CONCAT22((short)((unkuint10)auVar234._0_10_ >> 0x40),(short)((unkuint9)Var83 >> 8)
                          );
        auVar184._0_8_ = CONCAT26(auVar234._10_2_,CONCAT24((short)uVar86,uVar183));
        auVar184._8_2_ = (short)uVar87;
        auVar184._10_2_ = auVar235._12_2_;
        auVar191._12_2_ = uVar88;
        auVar191._0_12_ = auVar184;
        auVar191._14_2_ = auVar238._14_2_;
        auVar157._8_4_ = (int)((ulong)auVar166._0_8_ >> 0x20);
        auVar157._0_8_ = auVar166._0_8_;
        auVar157._12_4_ = (int)((ulong)auVar184._0_8_ >> 0x20);
        *(ulong *)(pUVar93 + lVar90 * -4) = CONCAT44(uVar183,uVar162);
        *(long *)(pUVar93 + lVar90 * -5) = auVar157._8_8_;
        *(int *)(pUVar93 + lVar90 * -6) = auVar166._8_4_;
        *(int *)(pUVar93 + lVar90 * -6 + 4) = auVar184._8_4_;
        *(int *)(pUVar93 + lVar90 * -7 + 8) = auVar174._12_4_;
        *(int *)(pUVar93 + lVar90 * -7 + 0xc) = auVar191._12_4_;
        pUVar94 = pUVar94 + -8;
        pUVar93 = pUVar93 + lVar90 * 8;
      }
      auVar169._0_2_ = auVar169._0_2_ + 8;
      auVar169._2_2_ = sVar105 + 8;
      auVar169._4_2_ = sVar122 + 8;
      auVar169._6_2_ = sVar125 + 8;
      auVar169._8_2_ = sVar127 + 8;
      auVar169._10_2_ = sVar123 + 8;
      auVar169._12_2_ = sVar124 + 8;
      auVar169._14_2_ = sVar195 + 8;
      pUVar91 = pUVar91 + 8;
    }
  }
  else if (nt == 4) {
    auVar138._4_4_ = uVar1;
    auVar138._0_4_ = uVar1;
    auVar138._8_4_ = uVar1;
    auVar138._12_4_ = uVar1;
    auVar139 = pmulld(auVar138,_DAT_0016cbc0);
    auVar169 = pmovsxbd(in_XMM2,0x1e1f1e1f);
    auVar169 = auVar169 & auVar139;
    auVar140._0_4_ = auVar139._0_4_ >> 5;
    auVar140._4_4_ = auVar139._4_4_ >> 5;
    auVar140._8_4_ = auVar139._8_4_ >> 5;
    auVar140._12_4_ = auVar139._12_4_ >> 5;
    auVar186 = pmovsxbd(in_XMM3,0x4040404);
    auVar139 = pmovsxbd(auVar140,0x20202020);
    auVar141._0_4_ = auVar139._0_4_ - auVar169._0_4_;
    auVar141._4_4_ = auVar139._4_4_ - auVar169._4_4_;
    auVar141._8_4_ = auVar139._8_4_ - auVar169._8_4_;
    auVar141._12_4_ = auVar139._12_4_ - auVar169._12_4_;
    auVar139 = psllw(auVar169,8);
    auVar209 = psllw(auVar141,8);
    auVar139 = auVar139 | auVar169;
    auVar209 = auVar209 | auVar141;
    uVar133 = CONCAT13(auVar139[9],CONCAT12(auVar209[9],CONCAT11(auVar139[8],auVar209[8])));
    uVar132 = CONCAT13(auVar139[0xd],CONCAT12(auVar209[0xd],CONCAT11(auVar139[0xc],auVar209[0xc])));
    auVar217._0_14_ = auVar209._0_14_;
    auVar217[0xe] = auVar209[7];
    auVar217[0xf] = auVar139[7];
    auVar216._14_2_ = auVar217._14_2_;
    auVar216._0_13_ = auVar209._0_13_;
    auVar216[0xd] = auVar139[6];
    auVar215._13_3_ = auVar216._13_3_;
    auVar215._0_12_ = auVar209._0_12_;
    auVar215[0xc] = auVar209[6];
    auVar214._12_4_ = auVar215._12_4_;
    auVar214._0_11_ = auVar209._0_11_;
    auVar214[0xb] = auVar139[5];
    auVar213._11_5_ = auVar214._11_5_;
    auVar213._0_10_ = auVar209._0_10_;
    auVar213[10] = auVar209[5];
    auVar212._10_6_ = auVar213._10_6_;
    auVar212._0_9_ = auVar209._0_9_;
    auVar212[9] = auVar139[4];
    auVar211._9_7_ = auVar212._9_7_;
    auVar211._0_8_ = auVar209._0_8_;
    auVar211[8] = auVar209[4];
    auVar64._1_8_ = auVar211._8_8_;
    auVar64[0] = auVar139[3];
    auVar64._9_7_ = 0;
    auVar63._10_6_ = 0;
    auVar63._0_10_ = SUB1610(auVar64 << 0x38,6);
    auVar62._11_5_ = 0;
    auVar62._0_11_ = SUB1611(auVar63 << 0x30,5);
    auVar210._4_12_ = SUB1612(auVar62 << 0x28,4);
    auVar210[3] = auVar139[1];
    auVar210[2] = auVar209[1];
    auVar210[0] = auVar209[0];
    auVar210[1] = auVar139[0];
    auVar139 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(auVar186._0_4_ - auVar140._0_4_) + -1)
                      ,(undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar209 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(auVar186._4_4_ - auVar140._4_4_) + -1)
                      ,(undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar198 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(auVar186._8_4_ - auVar140._8_4_) + -1)
                      ,(undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar186 = pshufb(*(undefined1 (*) [16])
                       (pu1_ref + (long)(auVar186._12_4_ - auVar140._12_4_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    uVar160 = auVar210._0_4_;
    uVar106 = auVar211._8_4_;
    auVar108._4_4_ = uVar160;
    auVar108._0_4_ = uVar160;
    auVar108._8_4_ = uVar160;
    auVar108._12_4_ = uVar160;
    auVar169 = pmaddubsw(auVar139,auVar108);
    auVar109._4_4_ = uVar106;
    auVar109._0_4_ = uVar106;
    auVar109._8_4_ = uVar106;
    auVar109._12_4_ = uVar106;
    auVar209 = pmaddubsw(auVar209,auVar109);
    auVar110._4_4_ = uVar133;
    auVar110._0_4_ = uVar133;
    auVar110._8_4_ = uVar133;
    auVar110._12_4_ = uVar133;
    auVar198 = pmaddubsw(auVar198,auVar110);
    auVar111._4_4_ = uVar132;
    auVar111._0_4_ = uVar132;
    auVar111._8_4_ = uVar132;
    auVar111._12_4_ = uVar132;
    auVar186 = pmaddubsw(auVar186,auVar111);
    auVar139 = pmovsxbw(auVar111,0x1010101010101010);
    sVar104 = auVar139._0_2_;
    auVar142._0_2_ = auVar169._0_2_ + sVar104;
    sVar121 = auVar139._2_2_;
    auVar142._2_2_ = auVar169._2_2_ + sVar121;
    sVar105 = auVar139._4_2_;
    auVar142._4_2_ = auVar169._4_2_ + sVar105;
    sVar122 = auVar139._6_2_;
    auVar142._6_2_ = auVar169._6_2_ + sVar122;
    sVar125 = auVar139._8_2_;
    auVar142._8_2_ = auVar169._8_2_ + sVar125;
    sVar127 = auVar139._10_2_;
    auVar142._10_2_ = auVar169._10_2_ + sVar127;
    sVar123 = auVar139._12_2_;
    auVar142._12_2_ = auVar169._12_2_ + sVar123;
    sVar124 = auVar139._14_2_;
    auVar142._14_2_ = auVar169._14_2_ + sVar124;
    auVar170._0_2_ = auVar209._0_2_ + sVar104;
    auVar170._2_2_ = auVar209._2_2_ + sVar121;
    auVar170._4_2_ = auVar209._4_2_ + sVar105;
    auVar170._6_2_ = auVar209._6_2_ + sVar122;
    auVar170._8_2_ = auVar209._8_2_ + sVar125;
    auVar170._10_2_ = auVar209._10_2_ + sVar127;
    auVar170._12_2_ = auVar209._12_2_ + sVar123;
    auVar170._14_2_ = auVar209._14_2_ + sVar124;
    auVar199._0_2_ = auVar198._0_2_ + sVar104;
    auVar199._2_2_ = auVar198._2_2_ + sVar121;
    auVar199._4_2_ = auVar198._4_2_ + sVar105;
    auVar199._6_2_ = auVar198._6_2_ + sVar122;
    auVar199._8_2_ = auVar198._8_2_ + sVar125;
    auVar199._10_2_ = auVar198._10_2_ + sVar127;
    auVar199._12_2_ = auVar198._12_2_ + sVar123;
    auVar199._14_2_ = auVar198._14_2_ + sVar124;
    auVar187._0_2_ = auVar186._0_2_ + sVar104;
    auVar187._2_2_ = auVar186._2_2_ + sVar121;
    auVar187._4_2_ = auVar186._4_2_ + sVar105;
    auVar187._6_2_ = auVar186._6_2_ + sVar122;
    auVar187._8_2_ = auVar186._8_2_ + sVar125;
    auVar187._10_2_ = auVar186._10_2_ + sVar127;
    auVar187._12_2_ = auVar186._12_2_ + sVar123;
    auVar187._14_2_ = auVar186._14_2_ + sVar124;
    auVar139 = psraw(auVar142,5);
    auVar169 = psraw(auVar170,5);
    auVar209 = psraw(auVar199,5);
    sVar104 = auVar139._0_2_;
    sVar121 = auVar139._2_2_;
    auVar143[1] = (0 < sVar121) * (sVar121 < 0x100) * auVar139[2] - (0xff < sVar121);
    auVar143[0] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[0] - (0xff < sVar104);
    sVar104 = auVar139._4_2_;
    auVar143[2] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[4] - (0xff < sVar104);
    sVar104 = auVar139._6_2_;
    auVar143[3] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[6] - (0xff < sVar104);
    sVar104 = auVar139._8_2_;
    auVar143[4] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[8] - (0xff < sVar104);
    sVar104 = auVar139._10_2_;
    auVar143[5] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[10] - (0xff < sVar104);
    sVar104 = auVar139._12_2_;
    auVar143[6] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[0xc] - (0xff < sVar104);
    sVar104 = auVar139._14_2_;
    auVar143[7] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[0xe] - (0xff < sVar104);
    sVar104 = auVar209._0_2_;
    auVar143[8] = (0 < sVar104) * (sVar104 < 0x100) * auVar209[0] - (0xff < sVar104);
    sVar104 = auVar209._2_2_;
    auVar143[9] = (0 < sVar104) * (sVar104 < 0x100) * auVar209[2] - (0xff < sVar104);
    sVar104 = auVar209._4_2_;
    auVar143[10] = (0 < sVar104) * (sVar104 < 0x100) * auVar209[4] - (0xff < sVar104);
    sVar104 = auVar209._6_2_;
    auVar143[0xb] = (0 < sVar104) * (sVar104 < 0x100) * auVar209[6] - (0xff < sVar104);
    sVar104 = auVar209._8_2_;
    auVar143[0xc] = (0 < sVar104) * (sVar104 < 0x100) * auVar209[8] - (0xff < sVar104);
    sVar104 = auVar209._10_2_;
    auVar143[0xd] = (0 < sVar104) * (sVar104 < 0x100) * auVar209[10] - (0xff < sVar104);
    sVar104 = auVar209._12_2_;
    auVar143[0xe] = (0 < sVar104) * (sVar104 < 0x100) * auVar209[0xc] - (0xff < sVar104);
    sVar104 = auVar209._14_2_;
    auVar143[0xf] = (0 < sVar104) * (sVar104 < 0x100) * auVar209[0xe] - (0xff < sVar104);
    auVar139 = psraw(auVar187,5);
    sVar104 = auVar169._0_2_;
    sVar121 = auVar169._2_2_;
    auVar171[1] = (0 < sVar121) * (sVar121 < 0x100) * auVar169[2] - (0xff < sVar121);
    auVar171[0] = (0 < sVar104) * (sVar104 < 0x100) * auVar169[0] - (0xff < sVar104);
    sVar104 = auVar169._4_2_;
    auVar171[2] = (0 < sVar104) * (sVar104 < 0x100) * auVar169[4] - (0xff < sVar104);
    sVar104 = auVar169._6_2_;
    auVar171[3] = (0 < sVar104) * (sVar104 < 0x100) * auVar169[6] - (0xff < sVar104);
    sVar104 = auVar169._8_2_;
    auVar171[4] = (0 < sVar104) * (sVar104 < 0x100) * auVar169[8] - (0xff < sVar104);
    sVar104 = auVar169._10_2_;
    auVar171[5] = (0 < sVar104) * (sVar104 < 0x100) * auVar169[10] - (0xff < sVar104);
    sVar104 = auVar169._12_2_;
    auVar171[6] = (0 < sVar104) * (sVar104 < 0x100) * auVar169[0xc] - (0xff < sVar104);
    sVar104 = auVar169._14_2_;
    auVar171[7] = (0 < sVar104) * (sVar104 < 0x100) * auVar169[0xe] - (0xff < sVar104);
    sVar104 = auVar139._0_2_;
    auVar171[8] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[0] - (0xff < sVar104);
    sVar104 = auVar139._2_2_;
    auVar171[9] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[2] - (0xff < sVar104);
    sVar104 = auVar139._4_2_;
    auVar171[10] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[4] - (0xff < sVar104);
    sVar104 = auVar139._6_2_;
    auVar171[0xb] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[6] - (0xff < sVar104);
    sVar104 = auVar139._8_2_;
    auVar171[0xc] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[8] - (0xff < sVar104);
    sVar104 = auVar139._10_2_;
    auVar171[0xd] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[10] - (0xff < sVar104);
    sVar104 = auVar139._12_2_;
    auVar171[0xe] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[0xc] - (0xff < sVar104);
    sVar104 = auVar139._14_2_;
    auVar171[0xf] = (0 < sVar104) * (sVar104 < 0x100) * auVar139[0xe] - (0xff < sVar104);
    auVar169 = pshufb(auVar171,ZEXT816(0xb030a0209010800));
    auVar139 = pshufb(auVar143,ZEXT816(0xb030a0209010800));
    auVar151._0_14_ = auVar139._0_14_;
    auVar151[0xe] = auVar139[7];
    auVar151[0xf] = auVar169[7];
    auVar150._14_2_ = auVar151._14_2_;
    auVar150._0_13_ = auVar139._0_13_;
    auVar150[0xd] = auVar169[6];
    auVar149._13_3_ = auVar150._13_3_;
    auVar149._0_12_ = auVar139._0_12_;
    auVar149[0xc] = auVar139[6];
    auVar148._12_4_ = auVar149._12_4_;
    auVar148._0_11_ = auVar139._0_11_;
    auVar148[0xb] = auVar169[5];
    auVar147._11_5_ = auVar148._11_5_;
    auVar147._0_10_ = auVar139._0_10_;
    auVar147[10] = auVar139[5];
    auVar146._10_6_ = auVar147._10_6_;
    auVar146._0_9_ = auVar139._0_9_;
    auVar146[9] = auVar169[4];
    auVar145._9_7_ = auVar146._9_7_;
    auVar145._0_8_ = auVar139._0_8_;
    auVar145[8] = auVar139[4];
    auVar65._4_8_ = auVar145._8_8_;
    auVar65[3] = auVar169[3];
    auVar65[2] = auVar139[3];
    auVar65[1] = auVar169[2];
    auVar65[0] = auVar139[2];
    auVar144._4_12_ = auVar65;
    auVar144[3] = auVar169[1];
    auVar144[2] = auVar139[1];
    auVar144[0] = auVar139[0];
    auVar144[1] = auVar169[0];
    *(undefined4 *)pu1_dst = auVar148._12_4_;
    lVar90 = (long)dst_strd;
    *(int *)(pu1_dst + lVar90) = auVar145._8_4_;
    *(int *)(pu1_dst + lVar90 * 2) = auVar65._0_4_;
    *(int *)(pu1_dst + lVar90 * 3) = auVar144._0_4_;
  }
  else {
    auVar139 = pshuflw(ZEXT416(uVar1),ZEXT416(uVar1),0);
    auVar169 = pshuflw(ZEXT416((uint)nt),ZEXT416((uint)nt),0);
    auVar175._0_2_ = auVar139._0_2_;
    sVar104 = auVar139._2_2_;
    auVar175._2_2_ = sVar104 * 2;
    auVar175._4_2_ = auVar175._0_2_ * 3;
    auVar175._6_2_ = sVar104 * 4;
    auVar175._8_2_ = auVar175._0_2_ * 5;
    auVar175._10_2_ = sVar104 * 6;
    auVar175._12_2_ = auVar175._0_2_ * 7;
    auVar175._14_2_ = sVar104 * 8;
    auVar209 = pmovsxbw(in_XMM3,0x1c1f1e1f1c1f1e1f);
    auVar209 = auVar209 & auVar175;
    auVar139 = psraw(auVar175,5);
    sVar104 = auVar169._0_2_;
    sVar121 = auVar169._2_2_;
    auVar169 = pmovsxbw(auVar139,0x2020202020202020);
    auVar176._0_2_ = auVar169._0_2_ - auVar209._0_2_;
    auVar176._2_2_ = auVar169._2_2_ - auVar209._2_2_;
    auVar176._4_2_ = auVar169._4_2_ - auVar209._4_2_;
    auVar176._6_2_ = auVar169._6_2_ - auVar209._6_2_;
    auVar176._8_2_ = auVar169._8_2_ - auVar209._8_2_;
    auVar176._10_2_ = auVar169._10_2_ - auVar209._10_2_;
    auVar176._12_2_ = auVar169._12_2_ - auVar209._12_2_;
    auVar176._14_2_ = auVar169._14_2_ - auVar209._14_2_;
    auVar169 = psllw(auVar209,8);
    auVar186 = psllw(auVar176,8);
    auVar169 = auVar169 | auVar209;
    auVar186 = auVar186 | auVar176;
    uVar132 = CONCAT13(auVar169[9],CONCAT12(auVar186[9],CONCAT11(auVar169[8],auVar186[8])));
    auVar208._0_8_ =
         CONCAT17(auVar169[0xb],
                  CONCAT16(auVar186[0xb],CONCAT15(auVar169[10],CONCAT14(auVar186[10],uVar132))));
    auVar208[8] = auVar186[0xc];
    auVar208[9] = auVar169[0xc];
    auVar208[10] = auVar186[0xd];
    auVar208[0xb] = auVar169[0xd];
    auVar223[0xc] = auVar186[0xe];
    auVar223._0_12_ = auVar208;
    auVar223[0xd] = auVar169[0xe];
    auVar223[0xe] = auVar186[0xf];
    auVar223[0xf] = auVar169[0xf];
    auVar253._0_14_ = auVar186._0_14_;
    auVar253[0xe] = auVar186[7];
    auVar253[0xf] = auVar169[7];
    auVar252._14_2_ = auVar253._14_2_;
    auVar252._0_13_ = auVar186._0_13_;
    auVar252[0xd] = auVar169[6];
    auVar251._13_3_ = auVar252._13_3_;
    auVar251._0_12_ = auVar186._0_12_;
    auVar251[0xc] = auVar186[6];
    auVar250._12_4_ = auVar251._12_4_;
    auVar250._0_11_ = auVar186._0_11_;
    auVar250[0xb] = auVar169[5];
    auVar249._11_5_ = auVar250._11_5_;
    auVar249._0_10_ = auVar186._0_10_;
    auVar249[10] = auVar186[5];
    auVar248._10_6_ = auVar249._10_6_;
    auVar248._0_9_ = auVar186._0_9_;
    auVar248[9] = auVar169[4];
    auVar247._9_7_ = auVar248._9_7_;
    auVar247._0_8_ = auVar186._0_8_;
    auVar247[8] = auVar186[4];
    auVar75._4_8_ = auVar247._8_8_;
    auVar75[3] = auVar169[3];
    auVar75[2] = auVar186[3];
    auVar75[1] = auVar169[2];
    auVar75[0] = auVar186[2];
    auVar246._4_12_ = auVar75;
    auVar246[3] = auVar169[1];
    auVar246[2] = auVar186[1];
    auVar246[0] = auVar186[0];
    auVar246[1] = auVar169[0];
    auVar209 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(short)(sVar104 - auVar139._0_2_) + -1)
                      ,(undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar198 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(short)(sVar121 - auVar139._2_2_) + -1)
                      ,(undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar256 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(short)(sVar104 - auVar139._4_2_) + -1)
                      ,(undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar254 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(short)(sVar121 - auVar139._6_2_) + -1)
                      ,(undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar169 = pshufb(*(undefined1 (*) [16])(pu1_ref + (long)(short)(sVar104 - auVar139._8_2_) + -1)
                      ,(undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar202 = pshufb(*(undefined1 (*) [16])
                       (pu1_ref + (long)(short)(sVar121 - auVar139._10_2_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar239 = pshufb(*(undefined1 (*) [16])
                       (pu1_ref + (long)(short)(sVar104 - auVar139._12_2_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    auVar225 = pshufb(*(undefined1 (*) [16])
                       (pu1_ref + (long)(short)(sVar121 - auVar139._14_2_) + -1),
                      (undefined1  [16])IHEVCE_SHUFFLEMASKY11);
    uVar160 = auVar246._0_4_;
    uVar106 = auVar75._0_4_;
    uVar133 = auVar247._8_4_;
    auVar139._4_4_ = uVar160;
    auVar139._0_4_ = uVar160;
    auVar139._8_4_ = uVar160;
    auVar139._12_4_ = uVar160;
    auVar186 = pmaddubsw(auVar209,auVar139);
    auVar209._4_4_ = uVar106;
    auVar209._0_4_ = uVar106;
    auVar209._8_4_ = uVar106;
    auVar209._12_4_ = uVar106;
    auVar209 = pmaddubsw(auVar198,auVar209);
    auVar112._4_4_ = uVar133;
    auVar112._0_4_ = uVar133;
    auVar112._8_4_ = uVar133;
    auVar112._12_4_ = uVar133;
    auVar256 = pmaddubsw(auVar256,auVar112);
    auVar113._4_4_ = auVar250._12_4_;
    auVar113._0_4_ = auVar250._12_4_;
    auVar113._8_4_ = auVar250._12_4_;
    auVar113._12_4_ = auVar250._12_4_;
    auVar254 = pmaddubsw(auVar254,auVar113);
    uVar160 = (undefined4)((ulong)auVar208._0_8_ >> 0x20);
    uVar106 = auVar208._8_4_;
    uVar133 = auVar223._12_4_;
    auVar114._4_4_ = uVar132;
    auVar114._0_4_ = uVar132;
    auVar114._8_4_ = uVar132;
    auVar114._12_4_ = uVar132;
    auVar169 = pmaddubsw(auVar169,auVar114);
    auVar115._4_4_ = uVar160;
    auVar115._0_4_ = uVar160;
    auVar115._8_4_ = uVar160;
    auVar115._12_4_ = uVar160;
    auVar198 = pmaddubsw(auVar202,auVar115);
    auVar116._4_4_ = uVar106;
    auVar116._0_4_ = uVar106;
    auVar116._8_4_ = uVar106;
    auVar116._12_4_ = uVar106;
    auVar239 = pmaddubsw(auVar239,auVar116);
    auVar117._4_4_ = uVar133;
    auVar117._0_4_ = uVar133;
    auVar117._8_4_ = uVar133;
    auVar117._12_4_ = uVar133;
    auVar202 = pmaddubsw(auVar225,auVar117);
    auVar139 = pmovsxbw(auVar117,0x1010101010101010);
    sVar105 = auVar139._0_2_;
    auVar177._0_2_ = auVar186._0_2_ + sVar105;
    sVar122 = auVar139._2_2_;
    auVar177._2_2_ = auVar186._2_2_ + sVar122;
    sVar123 = auVar139._4_2_;
    auVar177._4_2_ = auVar186._4_2_ + sVar123;
    sVar124 = auVar139._6_2_;
    auVar177._6_2_ = auVar186._6_2_ + sVar124;
    sVar126 = auVar139._8_2_;
    auVar177._8_2_ = auVar186._8_2_ + sVar126;
    sVar128 = auVar139._10_2_;
    auVar177._10_2_ = auVar186._10_2_ + sVar128;
    sVar129 = auVar139._12_2_;
    auVar177._12_2_ = auVar186._12_2_ + sVar129;
    sVar130 = auVar139._14_2_;
    auVar177._14_2_ = auVar186._14_2_ + sVar130;
    auVar192._0_2_ = auVar209._0_2_ + sVar105;
    auVar192._2_2_ = auVar209._2_2_ + sVar122;
    auVar192._4_2_ = auVar209._4_2_ + sVar123;
    auVar192._6_2_ = auVar209._6_2_ + sVar124;
    auVar192._8_2_ = auVar209._8_2_ + sVar126;
    auVar192._10_2_ = auVar209._10_2_ + sVar128;
    auVar192._12_2_ = auVar209._12_2_ + sVar129;
    auVar192._14_2_ = auVar209._14_2_ + sVar130;
    auVar257._0_2_ = auVar256._0_2_ + sVar105;
    auVar257._2_2_ = auVar256._2_2_ + sVar122;
    auVar257._4_2_ = auVar256._4_2_ + sVar123;
    auVar257._6_2_ = auVar256._6_2_ + sVar124;
    auVar257._8_2_ = auVar256._8_2_ + sVar126;
    auVar257._10_2_ = auVar256._10_2_ + sVar128;
    auVar257._12_2_ = auVar256._12_2_ + sVar129;
    auVar257._14_2_ = auVar256._14_2_ + sVar130;
    auVar255._0_2_ = auVar254._0_2_ + sVar105;
    auVar255._2_2_ = auVar254._2_2_ + sVar122;
    auVar255._4_2_ = auVar254._4_2_ + sVar123;
    auVar255._6_2_ = auVar254._6_2_ + sVar124;
    auVar255._8_2_ = auVar254._8_2_ + sVar126;
    auVar255._10_2_ = auVar254._10_2_ + sVar128;
    auVar255._12_2_ = auVar254._12_2_ + sVar129;
    auVar255._14_2_ = auVar254._14_2_ + sVar130;
    auVar209 = psraw(auVar177,5);
    auVar186 = psraw(auVar192,5);
    auVar254 = psraw(auVar257,5);
    sVar104 = auVar209._0_2_;
    sVar125 = auVar209._2_2_;
    sVar195 = auVar209._4_2_;
    sVar227 = auVar209._6_2_;
    sVar228 = auVar209._8_2_;
    sVar230 = auVar209._10_2_;
    sVar232 = auVar209._12_2_;
    sVar121 = auVar209._14_2_;
    cVar2 = (0 < sVar121) * (sVar121 < 0x100) * auVar209[0xe] - (0xff < sVar121);
    sVar15 = auVar254._0_2_;
    sVar19 = auVar254._2_2_;
    sVar23 = auVar254._4_2_;
    sVar27 = auVar254._6_2_;
    sVar31 = auVar254._8_2_;
    sVar36 = auVar254._10_2_;
    sVar44 = auVar254._12_2_;
    sVar52 = auVar254._14_2_;
    auVar225 = psraw(auVar255,5);
    sVar121 = auVar186._0_2_;
    sVar127 = auVar186._2_2_;
    sVar4 = auVar186._4_2_;
    sVar5 = auVar186._6_2_;
    sVar6 = auVar186._8_2_;
    sVar8 = auVar186._10_2_;
    sVar10 = auVar186._12_2_;
    sVar13 = auVar186._14_2_;
    sVar16 = auVar225._0_2_;
    sVar20 = auVar225._2_2_;
    sVar24 = auVar225._4_2_;
    sVar28 = auVar225._6_2_;
    sVar32 = auVar225._8_2_;
    sVar37 = auVar225._10_2_;
    sVar45 = auVar225._12_2_;
    sVar53 = auVar225._14_2_;
    auVar158._0_2_ = auVar169._0_2_ + sVar105;
    auVar158._2_2_ = auVar169._2_2_ + sVar122;
    auVar158._4_2_ = auVar169._4_2_ + sVar123;
    auVar158._6_2_ = auVar169._6_2_ + sVar124;
    auVar158._8_2_ = auVar169._8_2_ + sVar126;
    auVar158._10_2_ = auVar169._10_2_ + sVar128;
    auVar158._12_2_ = auVar169._12_2_ + sVar129;
    auVar158._14_2_ = auVar169._14_2_ + sVar130;
    auVar203._0_2_ = auVar198._0_2_ + sVar105;
    auVar203._2_2_ = auVar198._2_2_ + sVar122;
    auVar203._4_2_ = auVar198._4_2_ + sVar123;
    auVar203._6_2_ = auVar198._6_2_ + sVar124;
    auVar203._8_2_ = auVar198._8_2_ + sVar126;
    auVar203._10_2_ = auVar198._10_2_ + sVar128;
    auVar203._12_2_ = auVar198._12_2_ + sVar129;
    auVar203._14_2_ = auVar198._14_2_ + sVar130;
    auVar240._0_2_ = auVar239._0_2_ + sVar105;
    auVar240._2_2_ = auVar239._2_2_ + sVar122;
    auVar240._4_2_ = auVar239._4_2_ + sVar123;
    auVar240._6_2_ = auVar239._6_2_ + sVar124;
    auVar240._8_2_ = auVar239._8_2_ + sVar126;
    auVar240._10_2_ = auVar239._10_2_ + sVar128;
    auVar240._12_2_ = auVar239._12_2_ + sVar129;
    auVar240._14_2_ = auVar239._14_2_ + sVar130;
    auVar226._0_2_ = auVar202._0_2_ + sVar105;
    auVar226._2_2_ = auVar202._2_2_ + sVar122;
    auVar226._4_2_ = auVar202._4_2_ + sVar123;
    auVar226._6_2_ = auVar202._6_2_ + sVar124;
    auVar226._8_2_ = auVar202._8_2_ + sVar126;
    auVar226._10_2_ = auVar202._10_2_ + sVar128;
    auVar226._12_2_ = auVar202._12_2_ + sVar129;
    auVar226._14_2_ = auVar202._14_2_ + sVar130;
    auVar139 = psraw(auVar158,5);
    auVar169 = psraw(auVar203,5);
    auVar202 = psraw(auVar240,5);
    sVar105 = auVar139._0_2_;
    sVar123 = auVar139._2_2_;
    sVar126 = auVar139._4_2_;
    sVar129 = auVar139._6_2_;
    sVar7 = auVar139._8_2_;
    sVar9 = auVar139._10_2_;
    sVar11 = auVar139._12_2_;
    sVar122 = auVar139._14_2_;
    cVar3 = (0 < sVar122) * (sVar122 < 0x100) * auVar139[0xe] - (0xff < sVar122);
    sVar17 = auVar202._0_2_;
    sVar21 = auVar202._2_2_;
    sVar25 = auVar202._4_2_;
    sVar29 = auVar202._6_2_;
    sVar33 = auVar202._8_2_;
    sVar38 = auVar202._10_2_;
    sVar46 = auVar202._12_2_;
    sVar54 = auVar202._14_2_;
    auVar198 = psraw(auVar226,5);
    sVar122 = auVar169._0_2_;
    sVar124 = auVar169._2_2_;
    sVar128 = auVar169._4_2_;
    sVar130 = auVar169._6_2_;
    sVar229 = auVar169._8_2_;
    sVar231 = auVar169._10_2_;
    sVar12 = auVar169._12_2_;
    sVar14 = auVar169._14_2_;
    sVar18 = auVar198._0_2_;
    sVar22 = auVar198._2_2_;
    sVar26 = auVar198._4_2_;
    sVar30 = auVar198._6_2_;
    sVar34 = auVar198._8_2_;
    sVar39 = auVar198._10_2_;
    sVar47 = auVar198._12_2_;
    sVar55 = auVar198._14_2_;
    uVar85 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar186[0xe] - (0xff < sVar13),cVar2);
    uVar132 = CONCAT31(CONCAT21(uVar85,(0 < sVar10) * (sVar10 < 0x100) * auVar186[0xc] -
                                       (0xff < sVar10)),
                       (0 < sVar232) * (sVar232 < 0x100) * auVar209[0xc] - (0xff < sVar232));
    uVar84 = CONCAT51(CONCAT41(uVar132,(0 < sVar8) * (sVar8 < 0x100) * auVar186[10] - (0xff < sVar8)
                              ),(0 < sVar230) * (sVar230 < 0x100) * auVar209[10] - (0xff < sVar230))
    ;
    Var82 = CONCAT72(CONCAT61(uVar84,(0 < sVar6) * (sVar6 < 0x100) * auVar186[8] - (0xff < sVar6)),
                     CONCAT11((0 < sVar228) * (sVar228 < 0x100) * auVar209[8] - (0xff < sVar228),
                              cVar2));
    Var69 = CONCAT91(CONCAT81((long)((unkuint9)Var82 >> 8),
                              (0 < sVar5) * (sVar5 < 0x100) * auVar186[6] - (0xff < sVar5)),
                     (0 < sVar227) * (sVar227 < 0x100) * auVar209[6] - (0xff < sVar227));
    auVar77._2_10_ = Var69;
    auVar77[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar186[4] - (0xff < sVar4);
    auVar77[0] = (0 < sVar195) * (sVar195 < 0x100) * auVar209[4] - (0xff < sVar195);
    auVar76._2_12_ = auVar77;
    auVar76[1] = (0 < sVar127) * (sVar127 < 0x100) * auVar186[2] - (0xff < sVar127);
    auVar76[0] = (0 < sVar125) * (sVar125 < 0x100) * auVar209[2] - (0xff < sVar125);
    auVar118._0_2_ =
         CONCAT11((0 < sVar121) * (sVar121 < 0x100) * auVar186[0] - (0xff < sVar121),
                  (0 < sVar104) * (sVar104 < 0x100) * auVar209[0] - (0xff < sVar104));
    auVar118._2_14_ = auVar76;
    uVar161 = CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar225[0] - (0xff < sVar16),
                       (0 < sVar15) * (sVar15 < 0x100) * auVar254[0] - (0xff < sVar15));
    uVar106 = CONCAT13((0 < sVar20) * (sVar20 < 0x100) * auVar225[2] - (0xff < sVar20),
                       CONCAT12((0 < sVar19) * (sVar19 < 0x100) * auVar254[2] - (0xff < sVar19),
                                uVar161));
    uVar163 = CONCAT15((0 < sVar24) * (sVar24 < 0x100) * auVar225[4] - (0xff < sVar24),
                       CONCAT14((0 < sVar23) * (sVar23 < 0x100) * auVar254[4] - (0xff < sVar23),
                                uVar106));
    uVar164 = CONCAT17((0 < sVar28) * (sVar28 < 0x100) * auVar225[6] - (0xff < sVar28),
                       CONCAT16((0 < sVar27) * (sVar27 < 0x100) * auVar254[6] - (0xff < sVar27),
                                uVar163));
    auVar167._0_10_ =
         CONCAT19((0 < sVar32) * (sVar32 < 0x100) * auVar225[8] - (0xff < sVar32),
                  CONCAT18((0 < sVar31) * (sVar31 < 0x100) * auVar254[8] - (0xff < sVar31),uVar164))
    ;
    auVar167[10] = (0 < sVar36) * (sVar36 < 0x100) * auVar254[10] - (0xff < sVar36);
    auVar167[0xb] = (0 < sVar37) * (sVar37 < 0x100) * auVar225[10] - (0xff < sVar37);
    auVar168[0xc] = (0 < sVar44) * (sVar44 < 0x100) * auVar254[0xc] - (0xff < sVar44);
    auVar168._0_12_ = auVar167;
    auVar168[0xd] = (0 < sVar45) * (sVar45 < 0x100) * auVar225[0xc] - (0xff < sVar45);
    auVar178[0xe] = (0 < sVar52) * (sVar52 < 0x100) * auVar254[0xe] - (0xff < sVar52);
    auVar178._0_14_ = auVar168;
    auVar178[0xf] = (0 < sVar53) * (sVar53 < 0x100) * auVar225[0xe] - (0xff < sVar53);
    uVar88 = CONCAT11((0 < sVar14) * (sVar14 < 0x100) * auVar169[0xe] - (0xff < sVar14),cVar3);
    uVar160 = CONCAT31(CONCAT21(uVar88,(0 < sVar12) * (sVar12 < 0x100) * auVar169[0xc] -
                                       (0xff < sVar12)),
                       (0 < sVar11) * (sVar11 < 0x100) * auVar139[0xc] - (0xff < sVar11));
    uVar86 = CONCAT51(CONCAT41(uVar160,(0 < sVar231) * (sVar231 < 0x100) * auVar169[10] -
                                       (0xff < sVar231)),
                      (0 < sVar9) * (sVar9 < 0x100) * auVar139[10] - (0xff < sVar9));
    Var83 = CONCAT72(CONCAT61(uVar86,(0 < sVar229) * (sVar229 < 0x100) * auVar169[8] -
                                     (0xff < sVar229)),
                     CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar139[8] - (0xff < sVar7),cVar3));
    Var72 = CONCAT91(CONCAT81((long)((unkuint9)Var83 >> 8),
                              (0 < sVar130) * (sVar130 < 0x100) * auVar169[6] - (0xff < sVar130)),
                     (0 < sVar129) * (sVar129 < 0x100) * auVar139[6] - (0xff < sVar129));
    auVar79._2_10_ = Var72;
    auVar79[1] = (0 < sVar128) * (sVar128 < 0x100) * auVar169[4] - (0xff < sVar128);
    auVar79[0] = (0 < sVar126) * (sVar126 < 0x100) * auVar139[4] - (0xff < sVar126);
    auVar78._2_12_ = auVar79;
    auVar78[1] = (0 < sVar124) * (sVar124 < 0x100) * auVar169[2] - (0xff < sVar124);
    auVar78[0] = (0 < sVar123) * (sVar123 < 0x100) * auVar139[2] - (0xff < sVar123);
    auVar193._0_2_ =
         CONCAT11((0 < sVar122) * (sVar122 < 0x100) * auVar169[0] - (0xff < sVar122),
                  (0 < sVar105) * (sVar105 < 0x100) * auVar139[0] - (0xff < sVar105));
    auVar193._2_14_ = auVar78;
    uVar131 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * auVar198[0] - (0xff < sVar18),
                       (0 < sVar17) * (sVar17 < 0x100) * auVar202[0] - (0xff < sVar17));
    uVar133 = CONCAT13((0 < sVar22) * (sVar22 < 0x100) * auVar198[2] - (0xff < sVar22),
                       CONCAT12((0 < sVar21) * (sVar21 < 0x100) * auVar202[2] - (0xff < sVar21),
                                uVar131));
    uVar134 = CONCAT15((0 < sVar26) * (sVar26 < 0x100) * auVar198[4] - (0xff < sVar26),
                       CONCAT14((0 < sVar25) * (sVar25 < 0x100) * auVar202[4] - (0xff < sVar25),
                                uVar133));
    uVar135 = CONCAT17((0 < sVar30) * (sVar30 < 0x100) * auVar198[6] - (0xff < sVar30),
                       CONCAT16((0 < sVar29) * (sVar29 < 0x100) * auVar202[6] - (0xff < sVar29),
                                uVar134));
    auVar136._0_10_ =
         CONCAT19((0 < sVar34) * (sVar34 < 0x100) * auVar198[8] - (0xff < sVar34),
                  CONCAT18((0 < sVar33) * (sVar33 < 0x100) * auVar202[8] - (0xff < sVar33),uVar135))
    ;
    auVar136[10] = (0 < sVar38) * (sVar38 < 0x100) * auVar202[10] - (0xff < sVar38);
    auVar136[0xb] = (0 < sVar39) * (sVar39 < 0x100) * auVar198[10] - (0xff < sVar39);
    auVar137[0xc] = (0 < sVar46) * (sVar46 < 0x100) * auVar202[0xc] - (0xff < sVar46);
    auVar137._0_12_ = auVar136;
    auVar137[0xd] = (0 < sVar47) * (sVar47 < 0x100) * auVar198[0xc] - (0xff < sVar47);
    auVar159[0xe] = (0 < sVar54) * (sVar54 < 0x100) * auVar202[0xe] - (0xff < sVar54);
    auVar159._0_14_ = auVar137;
    auVar159[0xf] = (0 < sVar55) * (sVar55 < 0x100) * auVar198[0xe] - (0xff < sVar55);
    auVar207._0_12_ = auVar118._0_12_;
    auVar207._12_2_ = (short)Var69;
    auVar207._14_2_ = (short)((ulong)uVar164 >> 0x30);
    auVar206._12_4_ = auVar207._12_4_;
    auVar206._0_10_ = auVar118._0_10_;
    auVar206._10_2_ = (short)((uint6)uVar163 >> 0x20);
    auVar205._10_6_ = auVar206._10_6_;
    auVar205._0_8_ = auVar118._0_8_;
    auVar205._8_2_ = auVar77._0_2_;
    auVar80._4_8_ = auVar205._8_8_;
    auVar80._2_2_ = (short)((uint)uVar106 >> 0x10);
    auVar80._0_2_ = auVar76._0_2_;
    auVar204._0_4_ = CONCAT22(uVar161,auVar118._0_2_);
    auVar204._4_12_ = auVar80;
    uVar106 = CONCAT22((short)((unkuint10)auVar167._0_10_ >> 0x40),(short)((unkuint9)Var82 >> 8));
    auVar107._0_8_ = CONCAT26(auVar167._10_2_,CONCAT24((short)uVar84,uVar106));
    auVar107._8_2_ = (short)uVar132;
    auVar107._10_2_ = auVar168._12_2_;
    auVar119._12_2_ = uVar85;
    auVar119._0_12_ = auVar107;
    auVar119._14_2_ = auVar178._14_2_;
    uVar132 = CONCAT22((short)((unkuint10)auVar136._0_10_ >> 0x40),(short)((unkuint9)Var83 >> 8));
    auVar185._0_8_ = CONCAT26(auVar136._10_2_,CONCAT24((short)uVar86,uVar132));
    auVar185._8_2_ = (short)uVar160;
    auVar185._10_2_ = auVar137._12_2_;
    auVar194._12_2_ = uVar88;
    auVar194._0_12_ = auVar185;
    auVar194._14_2_ = auVar159._14_2_;
    *(int *)(pu1_dst + 8) = auVar119._12_4_;
    *(int *)(pu1_dst + 0xc) = auVar194._12_4_;
    auVar181._0_12_ = auVar193._0_12_;
    auVar181._12_2_ = (short)Var72;
    auVar181._14_2_ = (short)((ulong)uVar135 >> 0x30);
    auVar180._12_4_ = auVar181._12_4_;
    auVar180._0_10_ = auVar193._0_10_;
    auVar180._10_2_ = (short)((uint6)uVar134 >> 0x20);
    auVar179._10_6_ = auVar180._10_6_;
    auVar179._0_8_ = auVar193._0_8_;
    auVar179._8_2_ = auVar79._0_2_;
    auVar81._4_8_ = auVar179._8_8_;
    auVar81._2_2_ = (short)((uint)uVar133 >> 0x10);
    auVar81._0_2_ = auVar78._0_2_;
    auVar224._8_4_ = (int)((ulong)auVar107._0_8_ >> 0x20);
    auVar224._0_8_ = auVar107._0_8_;
    auVar224._12_4_ = (int)((ulong)auVar185._0_8_ >> 0x20);
    lVar90 = (long)dst_strd;
    *(int *)(pu1_dst + lVar90) = auVar107._8_4_;
    *(int *)(pu1_dst + lVar90 + 4) = auVar185._8_4_;
    *(long *)(pu1_dst + lVar90 * 2) = auVar224._8_8_;
    *(ulong *)(pu1_dst + lVar90 * 3) = CONCAT44(uVar132,uVar106);
    *(undefined4 *)(pu1_dst + lVar90 * 4 + 8) = auVar206._12_4_;
    *(undefined4 *)(pu1_dst + lVar90 * 4 + 0xc) = auVar180._12_4_;
    auVar120._0_8_ = auVar204._0_8_;
    auVar120._8_4_ = auVar80._0_4_;
    auVar120._12_4_ = auVar81._0_4_;
    *(int *)(pu1_dst + lVar90 * 5) = auVar205._8_4_;
    *(int *)(pu1_dst + lVar90 * 5 + 4) = auVar179._8_4_;
    *(long *)(pu1_dst + lVar90 * 6) = auVar120._8_8_;
    *(ulong *)(pu1_dst + lVar90 * 7) = CONCAT44(CONCAT22(uVar131,auVar193._0_2_),auVar204._0_4_);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_mode_3_to_9_sse42(UWORD8 *pu1_ref,
                                             WORD32 src_strd,
                                             UWORD8 *pu1_dst,
                                             WORD32 dst_strd,
                                             WORD32 nt,
                                             WORD32 mode)
{
    WORD32 row, col;
    WORD32 two_nt = 2 * nt;
    WORD32 intra_pred_ang;


    __m128i const_temp_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i fract_4x32b, intra_pred_ang_4x32b;
    __m128i row_4x32b, two_nt_4x32b, ref_main_idx_4x32b, res_temp5_4x32b, sm3;
    UNUSED(src_strd);


    /* Intra Pred Angle according to the mode */
    intra_pred_ang = gai4_ihevc_ang_table[mode];

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */

    const_temp_4x32b  = _mm_set1_epi16(16);
    const_temp2_4x32b = _mm_set1_epi32(31);
    const_temp3_4x32b = _mm_set1_epi32(32);
    const_temp4_4x32b = _mm_set1_epi32(4);

    two_nt_4x32b = _mm_set1_epi32(two_nt - nt);


    sm3 = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASKY11[0]);

    /* intra_pred_ang = gai4_ihevc_ang_table[mode]; */
    intra_pred_ang_4x32b = _mm_set1_epi32(intra_pred_ang);

    row_4x32b = _mm_set_epi32(4, 3, 2, 1);

    if(nt == 4)
    {

        WORD32 ref_main_idx1, ref_main_idx2, ref_main_idx3, ref_main_idx4;
        int temp11, temp21, temp31, temp41;
        // WORD8  ai1_fract_temp_val[16], ai1_row_temp_val[16];

        __m128i fract1_8x16b, fract2_8x16b;
        __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;

        __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
        __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b; //, src_temp8_8x16b;
        __m128i ref_main_temp0, ref_main_temp1, ref_main_temp2;

        /* pos = ((row + 1) * intra_pred_ang); */
        res_temp5_4x32b  = _mm_mullo_epi32(row_4x32b, intra_pred_ang_4x32b);

        /* idx = pos >> 5; */
        fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

        /* fract = pos & (31); */
        ref_main_idx_4x32b = _mm_sub_epi32(two_nt_4x32b, _mm_srai_epi32(res_temp5_4x32b,  5));

        /*(32 - fract) */
        row_4x32b = _mm_sub_epi32(const_temp3_4x32b, fract_4x32b);

        fract1_8x16b = _mm_slli_epi16(fract_4x32b, 8);
        fract2_8x16b = _mm_slli_epi16(row_4x32b, 8);

        fract_4x32b = _mm_or_si128(fract_4x32b, fract1_8x16b);
        row_4x32b = _mm_or_si128(row_4x32b, fract2_8x16b); /*(32 - fract) */

        fract2_8x16b = _mm_unpackhi_epi8(row_4x32b, fract_4x32b);
        fract1_8x16b = _mm_unpacklo_epi8(row_4x32b, fract_4x32b);

        temp1_8x16b =  _mm_shuffle_epi32(fract1_8x16b, 0x00);
        temp2_8x16b =  _mm_shuffle_epi32(fract1_8x16b, 0xaa);
        temp3_8x16b =  _mm_shuffle_epi32(fract2_8x16b, 0x00);
        temp4_8x16b =  _mm_shuffle_epi32(fract2_8x16b, 0xaa);

        ref_main_temp0 = _mm_srli_si128(ref_main_idx_4x32b, 4);  /* next 32 bit values */
        ref_main_temp1 = _mm_srli_si128(ref_main_idx_4x32b, 8);  /* next 32 bit values */
        ref_main_temp2 = _mm_srli_si128(ref_main_idx_4x32b, 12); /* next 32 bit values */
        ref_main_idx1  = _mm_cvtsi128_si32(ref_main_idx_4x32b);    /* col=0*/
        ref_main_idx2  = _mm_cvtsi128_si32(ref_main_temp0);  /* col=1*/
        ref_main_idx3  = _mm_cvtsi128_si32(ref_main_temp1);  /* col=2*/
        ref_main_idx4  = _mm_cvtsi128_si32(ref_main_temp2);  /* col=3*/

        /* loding 8-bit 16 pixels */
        src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx1 - 1)); /* col=0*/
        src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx2 - 1)); /* col=1*/
        src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx3 - 1)); /* col=2*/
        src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx4 - 1)); /* col=3*/

        src_temp1_8x16b =  _mm_shuffle_epi8(src_temp1_8x16b, sm3); /* col=0*/
        src_temp2_8x16b =  _mm_shuffle_epi8(src_temp2_8x16b, sm3); /* col=1*/
        src_temp3_8x16b =  _mm_shuffle_epi8(src_temp3_8x16b, sm3); /* col=2*/
        src_temp4_8x16b =  _mm_shuffle_epi8(src_temp4_8x16b, sm3); /* col=3*/

        /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
        src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
        src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
        src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
        src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

        /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
        src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
        src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
        src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
        src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

        /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
        src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
        src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
        src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
        src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

        /* converting 16 bit to 8 bit */
        src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp3_8x16b); /* col=0*/
        src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, src_temp4_8x16b); /* col=1*/


        src_temp5_8x16b = _mm_unpacklo_epi8(src_temp1_8x16b, src_temp2_8x16b);
        src_temp6_8x16b = _mm_unpackhi_epi8(src_temp1_8x16b, src_temp2_8x16b);

        src_temp3_8x16b = _mm_unpacklo_epi16(src_temp5_8x16b, src_temp6_8x16b);
        src_temp2_8x16b = _mm_srli_si128(src_temp3_8x16b, 4);
        src_temp1_8x16b = _mm_srli_si128(src_temp3_8x16b, 8);
        src_temp7_8x16b = _mm_srli_si128(src_temp3_8x16b, 12);

        temp11 = _mm_cvtsi128_si32(src_temp7_8x16b);
        temp21 = _mm_cvtsi128_si32(src_temp1_8x16b);
        temp31 = _mm_cvtsi128_si32(src_temp2_8x16b);
        temp41 = _mm_cvtsi128_si32(src_temp3_8x16b);

        /* loding 4-bit 8 pixels values */
        *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp11;
        *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp21;
        *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp31;
        *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp41;

    }

    else if(nt == 16 || nt == 32)
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(8);
        const_temp3_4x32b = _mm_set1_epi16(32);
        two_nt_4x32b = _mm_set1_epi16(two_nt);

        for(col = 0; col < nt; col += 8)
        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD16 pi2_ref_main_idx5, pi2_ref_main_idx6, pi2_ref_main_idx7, pi2_ref_main_idx8;
            //WORD8  ai1_fract_temp0_val[16], ai1_fract_temp1_val[16];

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract8_8x16b;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;
            __m128i temp11_8x16b, temp12_8x16b, temp13_8x16b, temp14_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* idx = pos >> 5; */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            /*(32 - fract) */
            fract2_8x16b =  _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            fract1_8x16b = _mm_slli_epi16(fract_4x32b, 8);
            fract3_8x16b = _mm_slli_epi16(fract2_8x16b, 8); /*(32 - fract) */

            fract_4x32b = _mm_or_si128(fract_4x32b, fract1_8x16b);
            fract2_8x16b = _mm_or_si128(fract2_8x16b, fract3_8x16b); /*(32 - fract) */


            fract8_8x16b = _mm_unpackhi_epi8(fract2_8x16b, fract_4x32b);
            fract_4x32b = _mm_unpacklo_epi8(fract2_8x16b, fract_4x32b);

            temp1_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x00);
            temp2_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x55);
            temp3_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xaa);
            temp4_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xff);

            temp11_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x00);
            temp12_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x55);
            temp13_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xaa);
            temp14_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xff);

            /* fract = pos & (31); */
            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, _mm_srai_epi16(res_temp5_4x32b,  5));

            row_4x32b = _mm_add_epi16(row_4x32b, const_temp4_4x32b);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            pi2_ref_main_idx5 = _mm_extract_epi16(ref_main_idx_4x32b, 4);    /* col=5*/
            pi2_ref_main_idx6 = _mm_extract_epi16(ref_main_idx_4x32b, 5);    /* col=6*/
            pi2_ref_main_idx7 = _mm_extract_epi16(ref_main_idx_4x32b, 6);    /* col=7*/
            pi2_ref_main_idx8 = _mm_extract_epi16(ref_main_idx_4x32b, 7);    /* col=8*/

            for(row = 0; row < nt; row += 8)
            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;


                __m128i src_temp11_8x16b, src_temp12_8x16b, src_temp13_8x16b, src_temp14_8x16b;
                __m128i src_temp15_8x16b, src_temp16_8x16b, src_temp17_8x16b, src_temp18_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - 1 - (8 + row))); /* col=0*/
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - 1 - (8 + row))); /* col=1*/
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - 1 - (8 + row))); /* col=2*/
                src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - 1 - (8 + row))); /* col=3*/

                /* loding 8-bit 16 pixels */
                src_temp11_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx5 - 1 - (8 + row))); /* col=5*/
                src_temp12_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx6 - 1 - (8 + row))); /* col=6*/
                src_temp13_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx7 - 1 - (8 + row))); /* col=7*/
                src_temp14_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx8 - 1 - (8 + row))); /* col=8*/

                src_temp1_8x16b =  _mm_shuffle_epi8(src_temp1_8x16b, sm3); /* col=0*/
                src_temp2_8x16b =  _mm_shuffle_epi8(src_temp2_8x16b, sm3); /* col=1*/
                src_temp3_8x16b =  _mm_shuffle_epi8(src_temp3_8x16b, sm3); /* col=2*/
                src_temp4_8x16b =  _mm_shuffle_epi8(src_temp4_8x16b, sm3); /* col=3*/

                src_temp11_8x16b =  _mm_shuffle_epi8(src_temp11_8x16b, sm3); /* col=0*/
                src_temp12_8x16b =  _mm_shuffle_epi8(src_temp12_8x16b, sm3); /* col=1*/
                src_temp13_8x16b =  _mm_shuffle_epi8(src_temp13_8x16b, sm3); /* col=2*/
                src_temp14_8x16b =  _mm_shuffle_epi8(src_temp14_8x16b, sm3); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp11_8x16b = _mm_maddubs_epi16(src_temp11_8x16b, temp11_8x16b);
                src_temp12_8x16b = _mm_maddubs_epi16(src_temp12_8x16b, temp12_8x16b);
                src_temp13_8x16b = _mm_maddubs_epi16(src_temp13_8x16b, temp13_8x16b);
                src_temp14_8x16b = _mm_maddubs_epi16(src_temp14_8x16b, temp14_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp11_8x16b = _mm_add_epi16(src_temp11_8x16b, const_temp_4x32b);
                src_temp12_8x16b = _mm_add_epi16(src_temp12_8x16b, const_temp_4x32b);
                src_temp13_8x16b = _mm_add_epi16(src_temp13_8x16b, const_temp_4x32b);
                src_temp14_8x16b = _mm_add_epi16(src_temp14_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp11_8x16b = _mm_srai_epi16(src_temp11_8x16b,  5);   /* col=5*/
                src_temp12_8x16b = _mm_srai_epi16(src_temp12_8x16b,  5);   /* col=6*/
                src_temp13_8x16b = _mm_srai_epi16(src_temp13_8x16b,  5);   /* col=7*/
                src_temp14_8x16b = _mm_srai_epi16(src_temp14_8x16b,  5);   /* col=8*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp3_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, src_temp4_8x16b); /* col=1*/

                /* converting 16 bit to 8 bit */
                src_temp11_8x16b = _mm_packus_epi16(src_temp11_8x16b, src_temp13_8x16b); /* col=5*/
                src_temp12_8x16b = _mm_packus_epi16(src_temp12_8x16b, src_temp14_8x16b); /* col=6*/

                src_temp5_8x16b = _mm_unpacklo_epi8(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpackhi_epi8(src_temp1_8x16b, src_temp2_8x16b);

                src_temp15_8x16b = _mm_unpacklo_epi8(src_temp11_8x16b, src_temp12_8x16b);
                src_temp16_8x16b = _mm_unpackhi_epi8(src_temp11_8x16b, src_temp12_8x16b);

                src_temp7_8x16b = _mm_unpacklo_epi16(src_temp5_8x16b, src_temp6_8x16b);
                src_temp8_8x16b = _mm_unpackhi_epi16(src_temp5_8x16b, src_temp6_8x16b);

                src_temp17_8x16b = _mm_unpacklo_epi16(src_temp15_8x16b, src_temp16_8x16b);
                src_temp18_8x16b = _mm_unpackhi_epi16(src_temp15_8x16b, src_temp16_8x16b);

                src_temp1_8x16b = _mm_unpacklo_epi32(src_temp7_8x16b, src_temp17_8x16b);
                src_temp2_8x16b = _mm_unpackhi_epi32(src_temp7_8x16b, src_temp17_8x16b);

                src_temp5_8x16b = _mm_srli_si128(src_temp1_8x16b, 8);
                src_temp6_8x16b = _mm_srli_si128(src_temp2_8x16b, 8);

                src_temp3_8x16b = _mm_unpacklo_epi32(src_temp8_8x16b, src_temp18_8x16b);
                src_temp4_8x16b = _mm_unpackhi_epi32(src_temp8_8x16b, src_temp18_8x16b);

                src_temp7_8x16b = _mm_srli_si128(src_temp3_8x16b, 8);
                src_temp8_8x16b = _mm_srli_si128(src_temp4_8x16b, 8);

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 7))), src_temp1_8x16b);          /* row=7*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 6))), src_temp5_8x16b);       /* row=6*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 5))), src_temp2_8x16b);       /* row=5*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 4))), src_temp6_8x16b);       /* row=4*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 3))), src_temp3_8x16b);       /* row=3*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 2))), src_temp7_8x16b);       /* row=2*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 1))), src_temp4_8x16b);       /* row=1*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 0))), src_temp8_8x16b);       /* row=0*/

            }
        }
    }
    else
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(8);
        const_temp3_4x32b = _mm_set1_epi16(32);
        two_nt_4x32b = _mm_set1_epi16(two_nt - nt);
        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD16 pi2_ref_main_idx5, pi2_ref_main_idx6, pi2_ref_main_idx7, pi2_ref_main_idx8;

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract8_8x16b;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;
            __m128i temp11_8x16b, temp12_8x16b, temp13_8x16b, temp14_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* idx = pos >> 5; */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            /* fract = pos & (31); */
            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, _mm_srai_epi16(res_temp5_4x32b,  5));

            /*(32 - fract) */
            fract2_8x16b =  _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            fract1_8x16b = _mm_slli_epi16(fract_4x32b, 8);
            fract3_8x16b = _mm_slli_epi16(fract2_8x16b, 8); /*(32 - fract) */

            fract_4x32b = _mm_or_si128(fract_4x32b, fract1_8x16b);
            fract2_8x16b = _mm_or_si128(fract2_8x16b, fract3_8x16b); /*(32 - fract) */


            fract8_8x16b = _mm_unpackhi_epi8(fract2_8x16b, fract_4x32b);
            fract_4x32b = _mm_unpacklo_epi8(fract2_8x16b, fract_4x32b);

            temp1_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x00);
            temp2_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x55);
            temp3_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xaa);
            temp4_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xff);

            temp11_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x00);
            temp12_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x55);
            temp13_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xaa);
            temp14_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xff);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            pi2_ref_main_idx5 = _mm_extract_epi16(ref_main_idx_4x32b, 4);    /* col=5*/
            pi2_ref_main_idx6 = _mm_extract_epi16(ref_main_idx_4x32b, 5);    /* col=6*/
            pi2_ref_main_idx7 = _mm_extract_epi16(ref_main_idx_4x32b, 6);    /* col=7*/
            pi2_ref_main_idx8 = _mm_extract_epi16(ref_main_idx_4x32b, 7);    /* col=8*/

            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;

                __m128i src_temp11_8x16b, src_temp12_8x16b, src_temp13_8x16b, src_temp14_8x16b;
                __m128i src_temp15_8x16b, src_temp16_8x16b, src_temp17_8x16b, src_temp18_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - 1)); /* col=0*/
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - 1)); /* col=1*/
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - 1)); /* col=2*/
                src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - 1)); /* col=3*/

                /* loding 8-bit 16 pixels */
                src_temp11_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx5 - 1)); /* col=5*/
                src_temp12_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx6 - 1)); /* col=6*/
                src_temp13_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx7 - 1)); /* col=7*/
                src_temp14_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx8 - 1)); /* col=8*/

                src_temp1_8x16b =  _mm_shuffle_epi8(src_temp1_8x16b, sm3); /* col=0*/
                src_temp2_8x16b =  _mm_shuffle_epi8(src_temp2_8x16b, sm3); /* col=1*/
                src_temp3_8x16b =  _mm_shuffle_epi8(src_temp3_8x16b, sm3); /* col=2*/
                src_temp4_8x16b =  _mm_shuffle_epi8(src_temp4_8x16b, sm3); /* col=3*/

                src_temp11_8x16b =  _mm_shuffle_epi8(src_temp11_8x16b, sm3); /* col=0*/
                src_temp12_8x16b =  _mm_shuffle_epi8(src_temp12_8x16b, sm3); /* col=1*/
                src_temp13_8x16b =  _mm_shuffle_epi8(src_temp13_8x16b, sm3); /* col=2*/
                src_temp14_8x16b =  _mm_shuffle_epi8(src_temp14_8x16b, sm3); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp11_8x16b = _mm_maddubs_epi16(src_temp11_8x16b, temp11_8x16b);
                src_temp12_8x16b = _mm_maddubs_epi16(src_temp12_8x16b, temp12_8x16b);
                src_temp13_8x16b = _mm_maddubs_epi16(src_temp13_8x16b, temp13_8x16b);
                src_temp14_8x16b = _mm_maddubs_epi16(src_temp14_8x16b, temp14_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp11_8x16b = _mm_add_epi16(src_temp11_8x16b, const_temp_4x32b);
                src_temp12_8x16b = _mm_add_epi16(src_temp12_8x16b, const_temp_4x32b);
                src_temp13_8x16b = _mm_add_epi16(src_temp13_8x16b, const_temp_4x32b);
                src_temp14_8x16b = _mm_add_epi16(src_temp14_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp11_8x16b = _mm_srai_epi16(src_temp11_8x16b,  5);   /* col=5*/
                src_temp12_8x16b = _mm_srai_epi16(src_temp12_8x16b,  5);   /* col=6*/
                src_temp13_8x16b = _mm_srai_epi16(src_temp13_8x16b,  5);   /* col=7*/
                src_temp14_8x16b = _mm_srai_epi16(src_temp14_8x16b,  5);   /* col=8*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp3_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, src_temp4_8x16b); /* col=1*/

                /* converting 16 bit to 8 bit */
                src_temp11_8x16b = _mm_packus_epi16(src_temp11_8x16b, src_temp13_8x16b); /* col=5*/
                src_temp12_8x16b = _mm_packus_epi16(src_temp12_8x16b, src_temp14_8x16b); /* col=6*/

                src_temp5_8x16b = _mm_unpacklo_epi8(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpackhi_epi8(src_temp1_8x16b, src_temp2_8x16b);

                src_temp15_8x16b = _mm_unpacklo_epi8(src_temp11_8x16b, src_temp12_8x16b);
                src_temp16_8x16b = _mm_unpackhi_epi8(src_temp11_8x16b, src_temp12_8x16b);

                src_temp7_8x16b = _mm_unpacklo_epi16(src_temp5_8x16b, src_temp6_8x16b);
                src_temp8_8x16b = _mm_unpackhi_epi16(src_temp5_8x16b, src_temp6_8x16b);

                src_temp17_8x16b = _mm_unpacklo_epi16(src_temp15_8x16b, src_temp16_8x16b);
                src_temp18_8x16b = _mm_unpackhi_epi16(src_temp15_8x16b, src_temp16_8x16b);

                src_temp1_8x16b = _mm_unpacklo_epi32(src_temp7_8x16b, src_temp17_8x16b);
                src_temp2_8x16b = _mm_unpackhi_epi32(src_temp7_8x16b, src_temp17_8x16b);

                src_temp5_8x16b = _mm_srli_si128(src_temp1_8x16b, 8);
                src_temp6_8x16b = _mm_srli_si128(src_temp2_8x16b, 8);

                src_temp3_8x16b = _mm_unpacklo_epi32(src_temp8_8x16b, src_temp18_8x16b);
                src_temp4_8x16b = _mm_unpackhi_epi32(src_temp8_8x16b, src_temp18_8x16b);

                src_temp7_8x16b = _mm_srli_si128(src_temp3_8x16b, 8);
                src_temp8_8x16b = _mm_srli_si128(src_temp4_8x16b, 8);

                _mm_storel_epi64((__m128i *)(pu1_dst), src_temp8_8x16b);       /* row=0*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 1)), src_temp4_8x16b);       /* row=1*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 2)), src_temp7_8x16b);       /* row=2*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 3)), src_temp3_8x16b);       /* row=3*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 4)), src_temp6_8x16b);       /* row=4*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 5)), src_temp2_8x16b);       /* row=5*/

                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 6)), src_temp5_8x16b);       /* row=6*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 7)), src_temp1_8x16b);          /* row=7*/

            }
        }
    }

}